

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void NtoS(int n,tmbstr str)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  tmbchar *ptVar5;
  bool bVar6;
  tmbchar buf [40];
  
  buf[0] = (char)n + (char)(n / 10) * -10 + '0';
  ptVar5 = str;
  if (n + 9U < 0x13) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      iVar2 = n >> 0x1f;
      iVar1 = n / 10 + iVar2;
      n = iVar1 - iVar2;
      buf[uVar3 + 1] = (char)n + (char)(n / 10) * -10 + '0';
      uVar3 = uVar3 + 1;
    } while (0x12 < (iVar1 - iVar2) + 9U);
    uVar4 = uVar3 & 0xffffffff;
  }
  do {
    *ptVar5 = buf[uVar4];
    bVar6 = uVar4 != 0;
    uVar4 = uVar4 - 1;
    ptVar5 = ptVar5 + 1;
  } while (bVar6);
  str[uVar3 + 1] = '\0';
  return;
}

Assistant:

static void NtoS(int n, tmbstr str)
{
    tmbchar buf[40];
    int i;
    
    for (i = 0;; ++i)
    {
        buf[i] = (tmbchar)( (n % 10) + '0' );
        
        n = n / 10;
        
        if (n == 0)
            break;
    }
    
    n = i;
    
    while (i >= 0)
    {
        str[n-i] = buf[i];
        --i;
    }
    
    str[n+1] = '\0';
}